

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O0

int xmlPatternMatch(xmlPatternPtr comp,xmlNodePtr node)

{
  int iVar1;
  int ret;
  xmlNodePtr node_local;
  xmlPatternPtr comp_local;
  
  if ((comp == (xmlPatternPtr)0x0) || (node_local = (xmlNodePtr)comp, node == (xmlNodePtr)0x0)) {
    comp_local._4_4_ = -1;
  }
  else {
    for (; node_local != (xmlNodePtr)0x0; node_local = (xmlNodePtr)node_local->name) {
      iVar1 = xmlPatMatch((xmlPatternPtr)node_local,node);
      if (iVar1 != 0) {
        return iVar1;
      }
    }
    comp_local._4_4_ = 0;
  }
  return comp_local._4_4_;
}

Assistant:

int
xmlPatternMatch(xmlPatternPtr comp, xmlNodePtr node)
{
    int ret = 0;

    if ((comp == NULL) || (node == NULL))
        return(-1);

    while (comp != NULL) {
        ret = xmlPatMatch(comp, node);
	if (ret != 0)
	    return(ret);
	comp = comp->next;
    }
    return(ret);
}